

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O3

xpath_variable * __thiscall
pugi::xpath_variable_set::add(xpath_variable_set *this,char_t *name,xpath_value_type type)

{
  xpath_value_type xVar1;
  int iVar2;
  char *pcVar3;
  xpath_variable *pxVar4;
  uint uVar5;
  char cVar6;
  
  cVar6 = *name;
  if (cVar6 == '\0') {
    uVar5 = 0;
  }
  else {
    pcVar3 = name + 1;
    uVar5 = 0;
    do {
      uVar5 = ((int)cVar6 + uVar5) * 0x401;
      uVar5 = uVar5 >> 6 ^ uVar5;
      cVar6 = *pcVar3;
      pcVar3 = pcVar3 + 1;
    } while (cVar6 != '\0');
    uVar5 = uVar5 * 9;
  }
  uVar5 = (uVar5 >> 0xb ^ uVar5) & 0x3f;
  pxVar4 = this->_data[uVar5];
  while( true ) {
    if (pxVar4 == (xpath_variable *)0x0) {
      pxVar4 = impl::anon_unknown_0::new_xpath_variable(type,name);
      if (pxVar4 == (xpath_variable *)0x0) {
        pxVar4 = (xpath_variable *)0x0;
      }
      else {
        pxVar4->_next = this->_data[uVar5];
        this->_data[uVar5] = pxVar4;
      }
      return pxVar4;
    }
    xVar1 = pxVar4->_type;
    iVar2 = strcmp((char *)((long)&pxVar4->_type + *(long *)(L"wb" + (long)(int)xVar1 * 2 + 2)),name
                  );
    if (iVar2 == 0) break;
    pxVar4 = pxVar4->_next;
  }
  if (xVar1 != type) {
    return (xpath_variable *)0x0;
  }
  return pxVar4;
}

Assistant:

PUGI_IMPL_FN xpath_variable* xpath_variable_set::add(const char_t* name, xpath_value_type type)
	{
		const size_t hash_size = sizeof(_data) / sizeof(_data[0]);
		size_t hash = impl::hash_string(name) % hash_size;

		// look for existing variable
		for (xpath_variable* var = _data[hash]; var; var = var->_next)
			if (impl::strequal(var->name(), name))
				return var->type() == type ? var : NULL;

		// add new variable
		xpath_variable* result = impl::new_xpath_variable(type, name);

		if (result)
		{
			result->_next = _data[hash];

			_data[hash] = result;
		}

		return result;
	}